

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  StkId pSVar6;
  Proto *p;
  int iVar7;
  char *pcVar8;
  Table *t;
  StkId pSVar9;
  size_t srclen;
  int iVar10;
  char *pcVar11;
  CallInfo *ci;
  int pc;
  long lVar12;
  char *pcVar13;
  Table *x_;
  TValue local_40;
  
  if (*what == '>') {
    pSVar9 = (StkId)((L->top).offset + -0x10);
    what = what + 1;
    (L->top).p = pSVar9;
    ci = (CallInfo *)0x0;
  }
  else {
    ci = ar->i_ci;
    pSVar9 = (ci->func).p;
  }
  if (((pSVar9->val).tt_ | 0x20) == 0x66) {
    lVar12 = *(long *)pSVar9;
  }
  else {
    lVar12 = 0;
  }
  iVar10 = 1;
  pcVar13 = what;
  do {
    cVar1 = *pcVar13;
    switch(cVar1) {
    case 'l':
      iVar7 = -1;
      if ((ci != (CallInfo *)0x0) && ((ci->callstatus & 0x8000) == 0)) {
        iVar7 = getcurrentline(ci);
      }
      ar->currentline = iVar7;
      break;
    case 'm':
    case 'o':
    case 'p':
    case 'q':
    case 's':
switchD_001098df_caseD_6d:
      iVar10 = 0;
      break;
    case 'n':
      if ((ci != (CallInfo *)0x0) && ((ci->callstatus & 0x400000) == 0)) {
        pcVar11 = funcnamefromcall(L,ci->previous,&ar->name);
        ar->namewhat = pcVar11;
        if (pcVar11 != (char *)0x0) break;
      }
      ar->namewhat = "";
      ar->name = (char *)0x0;
      break;
    case 'r':
      if ((ci == (CallInfo *)0x0) || ((ci->callstatus & 0x100000) == 0)) {
        ar->ftransfer = 0;
        ar->ntransfer = 0;
      }
      else {
        iVar7 = (L->transferinfo).ntransfer;
        ar->ftransfer = (L->transferinfo).ftransfer;
        ar->ntransfer = iVar7;
      }
      break;
    case 't':
      if (ci == (CallInfo *)0x0) {
        ar->extraargs = '\0';
        ar->istailcall = '\0';
      }
      else {
        uVar2 = ci->callstatus;
        ar->istailcall = (byte)(uVar2 >> 0x16) & 1;
        ar->extraargs = (byte)(uVar2 >> 8) & 0xf;
      }
      break;
    case 'u':
      if (lVar12 == 0) {
        ar->nups = '\0';
      }
      else {
        ar->nups = *(uchar *)(lVar12 + 10);
        if (*(char *)(lVar12 + 8) == '\x06') {
          ar->isvararg = *(byte *)(*(long *)(lVar12 + 0x18) + 0xb) & 1;
          ar->nparams = *(uchar *)(*(long *)(lVar12 + 0x18) + 10);
          break;
        }
      }
      ar->nparams = '\0';
      ar->isvararg = '\x01';
      break;
    default:
      if (cVar1 != 'L') {
        if (cVar1 == 'S') {
          if ((lVar12 == 0) || (*(char *)(lVar12 + 8) != '\x06')) {
            pcVar11 = "=[C]";
            ar->source = "=[C]";
            ar->srclen = 4;
            ar->linedefined = -1;
            ar->lastlinedefined = -1;
            pcVar8 = "C";
            srclen = 4;
          }
          else {
            lVar3 = *(long *)(lVar12 + 0x18);
            lVar4 = *(long *)(lVar3 + 0x70);
            if (lVar4 == 0) {
              pcVar11 = "=?";
              ar->source = "=?";
              ar->srclen = 2;
              srclen = 2;
            }
            else {
              srclen = (size_t)*(char *)(lVar4 + 0xb);
              if ((long)srclen < 0) {
                srclen = *(size_t *)(lVar4 + 0x10);
                pcVar11 = *(char **)(lVar4 + 0x18);
              }
              else {
                pcVar11 = (char *)(lVar4 + 0x18);
              }
              ar->srclen = srclen;
              ar->source = pcVar11;
            }
            uVar5 = *(undefined8 *)(lVar3 + 0x2c);
            ar->linedefined = (int)uVar5;
            ar->lastlinedefined = (int)((ulong)uVar5 >> 0x20);
            pcVar8 = "Lua";
            if ((int)uVar5 == 0) {
              pcVar8 = "main";
            }
          }
          ar->what = pcVar8;
          luaO_chunkid(ar->short_src,pcVar11,srclen);
        }
        else if (cVar1 != 'f') {
          if (cVar1 == '\0') {
            pcVar13 = strchr(what,0x66);
            if (pcVar13 != (char *)0x0) {
              pSVar6 = (L->top).p;
              *(Value *)pSVar6 = (pSVar9->val).value_;
              (pSVar6->val).tt_ = (pSVar9->val).tt_;
              (L->top).p = (StkId)((L->top).offset + 0x10);
            }
            pcVar13 = strchr(what,0x4c);
            if (pcVar13 != (char *)0x0) {
              if ((lVar12 == 0) || (*(char *)(lVar12 + 8) != '\x06')) {
                *(undefined1 *)((L->top).offset + 8) = 0;
                (L->top).p = (StkId)((L->top).offset + 0x10);
              }
              else {
                p = *(Proto **)(lVar12 + 0x18);
                iVar7 = p->linedefined;
                t = luaH_new(L);
                pSVar9 = (L->top).p;
                *(Table **)pSVar9 = t;
                (pSVar9->val).tt_ = 'E';
                (L->top).p = (StkId)((L->top).offset + 0x10);
                if (p->lineinfo != (ls_byte *)0x0) {
                  local_40.tt_ = '\x11';
                  pc = 0;
                  if ((p->flag & 1) != 0) {
                    iVar7 = nextline(p,iVar7,0);
                    pc = 1;
                  }
                  for (; pc < p->sizelineinfo; pc = pc + 1) {
                    iVar7 = nextline(p,iVar7,pc);
                    luaH_setint(L,t,(long)iVar7,&local_40);
                  }
                }
              }
            }
            return iVar10;
          }
          goto switchD_001098df_caseD_6d;
        }
      }
    }
    pcVar13 = pcVar13 + 1;
  } while( true );
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *cl;
  CallInfo *ci;
  TValue *func;
  lua_lock(L);
  if (*what == '>') {
    ci = NULL;
    func = s2v(L->top.p - 1);
    api_check(L, ttisfunction(func), "function expected");
    what++;  /* skip the '>' */
    L->top.p--;  /* pop function */
  }
  else {
    ci = ar->i_ci;
    func = s2v(ci->func.p);
    lua_assert(ttisfunction(func));
  }
  cl = ttisclosure(func) ? clvalue(func) : NULL;
  status = auxgetinfo(L, what, ar, cl, ci);
  if (strchr(what, 'f')) {
    setobj2s(L, L->top.p, func);
    api_incr_top(L);
  }
  if (strchr(what, 'L'))
    collectvalidlines(L, cl);
  lua_unlock(L);
  return status;
}